

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O3

void __thiscall
highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::deleteFixup
          (RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *this,LinkType x,
          LinkType nilParent)

{
  byte *pbVar1;
  uint *puVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  LinkType x_00;
  uint uVar8;
  int x_01;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  
  iVar4 = x;
  if (*this->rootNode != x) {
    do {
      lVar3 = *(long *)this[2].rootNode;
      x_00 = nilParent;
      if (x != -1) {
        lVar5 = (long)x;
        uVar8 = *(uint *)(lVar3 + 0x18 + lVar5 * 0x20);
        if ((int)uVar8 < 0) goto LAB_0029d6c4;
        x_00 = uVar8 - 1;
      }
      lVar5 = (long)x_00 * 0x20;
      iVar4 = *(int *)(lVar3 + 0x10 + lVar5);
      uVar11 = (ulong)(x == iVar4);
      x_01 = *(int *)(lVar3 + lVar5 + 0x10 + uVar11 * 4);
      if ((long)x_01 == -1) {
        x_01 = -1;
      }
      else {
        lVar6 = (long)x_01 * 0x20;
        uVar8 = *(uint *)(lVar3 + 0x18 + lVar6);
        if ((int)uVar8 < 0) {
          *(uint *)(lVar3 + lVar6 + 0x18) = uVar8 & 0x7fffffff;
          pbVar1 = (byte *)(lVar3 + 0x1b + lVar5);
          *pbVar1 = *pbVar1 | 0x80;
          rotate(this,x_00,(uint)(x != iVar4));
          lVar3 = *(long *)this[2].rootNode;
          x_01 = *(int *)(lVar3 + lVar5 + 0x10 + uVar11 * 4);
        }
      }
      lVar6 = (long)x_01;
      lVar9 = lVar6 * 0x20;
      piVar10 = (int *)(lVar3 + lVar9 + 0x10);
      if ((((long)*piVar10 != -1) && (*(int *)(lVar3 + 0x18 + (long)*piVar10 * 0x20) < 0)) ||
         ((lVar7 = (long)*(int *)(lVar3 + lVar9 + 0x14), lVar7 != -1 &&
          (*(int *)(lVar3 + 0x18 + lVar7 * 0x20) < 0)))) {
        if (((long)piVar10[uVar11] == -1) ||
           (-1 < *(int *)(lVar3 + 0x18 + (long)piVar10[uVar11] * 0x20))) {
          uVar12 = (ulong)(x != iVar4);
          puVar2 = (uint *)(lVar3 + 0x18 + (long)piVar10[uVar12] * 0x20);
          *puVar2 = *puVar2 & 0x7fffffff;
          pbVar1 = (byte *)(lVar3 + 0x1b + lVar9);
          *pbVar1 = *pbVar1 | 0x80;
          rotate(this,x_01,(uint)(x == iVar4));
          lVar3 = *(long *)this[2].rootNode;
          lVar6 = (long)*(int *)(lVar3 + lVar5 + 0x10 + uVar11 * 4);
        }
        else {
          uVar12 = (ulong)(x != iVar4);
        }
        lVar6 = lVar6 * 0x20;
        *(uint *)(lVar3 + 0x18 + lVar6) =
             *(uint *)(lVar3 + 0x18 + lVar5) & 0x80000000 |
             *(uint *)(lVar3 + 0x18 + lVar6) & 0x7fffffff;
        pbVar1 = (byte *)(lVar3 + 0x1b + lVar5);
        *pbVar1 = *pbVar1 & 0x7f;
        puVar2 = (uint *)(lVar3 + 0x18 + (long)*(int *)(lVar6 + lVar3 + 0x10 + uVar11 * 4) * 0x20);
        *puVar2 = *puVar2 & 0x7fffffff;
        rotate(this,x_00,(Dir)uVar12);
        iVar4 = *this->rootNode;
        break;
      }
      pbVar1 = (byte *)(lVar3 + 0x1b + lVar9);
      *pbVar1 = *pbVar1 | 0x80;
      x = x_00;
      iVar4 = *this->rootNode;
    } while (x_00 != *this->rootNode);
  }
  if (iVar4 != -1) {
    lVar3 = *(long *)this[2].rootNode;
    lVar5 = (long)iVar4;
    uVar8 = *(uint *)(lVar3 + 0x18 + lVar5 * 0x20);
LAB_0029d6c4:
    *(uint *)(lVar3 + 0x18 + lVar5 * 0x20) = uVar8 & 0x7fffffff;
  }
  return;
}

Assistant:

void deleteFixup(LinkType x, const LinkType nilParent) {
    while (x != rootNode && isBlack(x)) {
      Dir dir;

      LinkType p = x == kNoLink ? nilParent : getParent(x);
      dir = Dir(x == getChild(p, kLeft));
      LinkType w = getChild(p, dir);
      assert(w != kNoLink);

      if (isRed(w)) {
        makeBlack(w);
        makeRed(p);
        rotate(p, opposite(dir));
        assert((x == kNoLink && p == nilParent) ||
               (x != kNoLink && p == getParent(x)));
        w = getChild(p, dir);
        assert(w != kNoLink);
      }

      if (isBlack(getChild(w, kLeft)) && isBlack(getChild(w, kRight))) {
        makeRed(w);
        x = p;
      } else {
        if (isBlack(getChild(w, dir))) {
          makeBlack(getChild(w, opposite(dir)));
          makeRed(w);
          rotate(w, dir);
          assert((x == kNoLink && p == nilParent) ||
                 (x != kNoLink && p == getParent(x)));
          w = getChild(p, dir);
        }
        setColor(w, getColor(p));
        makeBlack(p);
        makeBlack(getChild(w, dir));
        rotate(p, opposite(dir));
        x = rootNode;
      }
    }

    if (x != kNoLink) makeBlack(x);
  }